

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O3

string * __thiscall
cmdline::parser::option_with_value<unsigned_long>::short_description_abi_cxx11_
          (string *__return_storage_ptr__,option_with_value<unsigned_long> *this)

{
  size_type *psVar1;
  undefined8 uVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  ulong uVar6;
  ulong *local_70;
  long local_68;
  ulong local_60;
  long lStack_58;
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"--",&this->nam);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_30);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_60 = *puVar5;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar5;
    local_70 = (ulong *)*plVar3;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  detail::readable_typename<unsigned_long>();
  uVar6 = 0xf;
  if (local_70 != &local_60) {
    uVar6 = local_60;
  }
  if (uVar6 < (ulong)(local_48 + local_68)) {
    uVar6 = 0xf;
    if (local_50 != local_40) {
      uVar6 = local_40[0];
    }
    if ((ulong)(local_48 + local_68) <= uVar6) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_70);
      goto LAB_0012827e;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50);
LAB_0012827e:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar2 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string short_description() const
			{
				return "--" + nam + "=" + detail::readable_typename<T>();
			}